

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

int xmlFAParseBranch(xmlRegParserCtxtPtr ctxt,xmlRegStatePtr to)

{
  int iVar1;
  bool bVar2;
  xmlRegStatePtr local_68;
  xmlRegStatePtr local_48;
  int local_2c;
  xmlRegStatePtr pxStack_28;
  int ret;
  xmlRegStatePtr previous;
  xmlRegStatePtr to_local;
  xmlRegParserCtxtPtr ctxt_local;
  
  pxStack_28 = ctxt->state;
  local_2c = xmlFAParsePiece(ctxt);
  if (local_2c == 0) {
    xmlFAGenerateEpsilonTransition(ctxt,pxStack_28,to);
  }
  else {
    local_48 = to;
    if (((*ctxt->cur != '|') && (*ctxt->cur != ')')) && (*ctxt->cur != '\0')) {
      local_48 = (xmlRegStatePtr)0x0;
    }
    iVar1 = xmlFAGenerateTransitions(ctxt,pxStack_28,local_48,ctxt->atom);
    if (iVar1 < 0) {
      xmlRegFreeAtom(ctxt->atom);
      ctxt->atom = (xmlRegAtomPtr)0x0;
      return -1;
    }
    pxStack_28 = ctxt->state;
    ctxt->atom = (xmlRegAtomPtr)0x0;
  }
  while( true ) {
    bVar2 = false;
    if (local_2c != 0) {
      bVar2 = ctxt->error == 0;
    }
    if (!bVar2) break;
    local_2c = xmlFAParsePiece(ctxt);
    if (local_2c != 0) {
      local_68 = to;
      if (((*ctxt->cur != '|') && (*ctxt->cur != ')')) && (*ctxt->cur != '\0')) {
        local_68 = (xmlRegStatePtr)0x0;
      }
      iVar1 = xmlFAGenerateTransitions(ctxt,pxStack_28,local_68,ctxt->atom);
      if (iVar1 < 0) {
        xmlRegFreeAtom(ctxt->atom);
        ctxt->atom = (xmlRegAtomPtr)0x0;
        return -1;
      }
      pxStack_28 = ctxt->state;
      ctxt->atom = (xmlRegAtomPtr)0x0;
    }
  }
  return 0;
}

Assistant:

static int
xmlFAParseBranch(xmlRegParserCtxtPtr ctxt, xmlRegStatePtr to) {
    xmlRegStatePtr previous;
    int ret;

    previous = ctxt->state;
    ret = xmlFAParsePiece(ctxt);
    if (ret == 0) {
        /* Empty branch */
	xmlFAGenerateEpsilonTransition(ctxt, previous, to);
    } else {
	if (xmlFAGenerateTransitions(ctxt, previous,
	        (CUR=='|' || CUR==')' || CUR==0) ? to : NULL,
                ctxt->atom) < 0) {
            xmlRegFreeAtom(ctxt->atom);
            ctxt->atom = NULL;
	    return(-1);
        }
	previous = ctxt->state;
	ctxt->atom = NULL;
    }
    while ((ret != 0) && (ctxt->error == 0)) {
	ret = xmlFAParsePiece(ctxt);
	if (ret != 0) {
	    if (xmlFAGenerateTransitions(ctxt, previous,
	            (CUR=='|' || CUR==')' || CUR==0) ? to : NULL,
                    ctxt->atom) < 0) {
                xmlRegFreeAtom(ctxt->atom);
                ctxt->atom = NULL;
                return(-1);
            }
	    previous = ctxt->state;
	    ctxt->atom = NULL;
	}
    }
    return(0);
}